

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O2

size_t objc_aligned_size(char *type)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = objc_sizeof_type(type);
  sVar2 = objc_alignof_type(type);
  return sVar1 + sVar1 % sVar2;
}

Assistant:

OBJC_PUBLIC
size_t objc_aligned_size(const char *type)
{
	size_t size  = objc_sizeof_type(type);
	size_t align = objc_alignof_type(type);
	return size + (size % align);
}